

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

Scope * __thiscall soul::AST::Scope::findChildScope(Scope *this,IdentifierPath *path)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  Scope local_28;
  
  sVar1 = (path->pathSections).numActive;
  if (sVar1 != 0) {
    lVar2 = 0;
    local_28._vptr_Scope = (_func_int **)path;
    do {
      findSubModuleNamed(&local_28,(Identifier)this);
      this = (Scope *)(local_28._vptr_Scope + 5);
      if ((IdentifierPath *)local_28._vptr_Scope == (IdentifierPath *)0x0) {
        return (Scope *)0x0;
      }
      bVar3 = sVar1 * 8 + -8 != lVar2;
      lVar2 = lVar2 + 8;
    } while (bVar3);
  }
  return (Scope *)(string *)this;
}

Assistant:

const Scope* findChildScope (const IdentifierPath& path) const
        {
            const Scope* s = this;

            for (auto& p : path.pathSections)
            {
                s = s->findSubModuleNamed (p).get();

                if (s == nullptr)
                    break;
            }

            return s;
        }